

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O2

size_t populate(uint16_t *buffer,size_t maxsize)

{
  uint64_t uVar1;
  uint64_t uVar2;
  size_t i;
  ulong uVar3;
  
  uVar1 = splitmix64();
  for (uVar3 = 0; uVar3 < uVar1 % maxsize; uVar3 = uVar3 + 1) {
    uVar2 = splitmix64();
    buffer[uVar3] = (uint16_t)uVar2;
  }
  return uVar1 % maxsize;
}

Assistant:

size_t populate(uint16_t* buffer, size_t maxsize) {
    size_t length = splitmix64() % maxsize;
    for (size_t i = 0; i < length; i++) {
        buffer[i] = (uint16_t)splitmix64();
    }
    return length;
}